

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

BYTE * find_central_dir(FILE *fin)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong local_488;
  long local_480;
  int local_474;
  int i;
  UINT32 read_pos;
  UINT32 read_size;
  long pos_found;
  long max_back;
  long back_read;
  long file_size;
  BYTE *dir;
  EndOfCentralDirectory eod;
  uchar buf [1028];
  FILE *fin_local;
  
  _read_pos = 0;
  fseek((FILE *)fin,0,2);
  lVar3 = ftell((FILE *)fin);
  local_480 = lVar3;
  if (0xfffe < lVar3) {
    local_480 = 0xffff;
  }
  max_back = 4;
  do {
    if (local_480 <= max_back) break;
    if (local_480 < max_back + 0x400) {
      max_back = local_480;
    }
    else {
      max_back = max_back + 0x400;
    }
    uVar1 = (int)lVar3 - (int)max_back;
    if ((long)(lVar3 - (ulong)uVar1) < 0x405) {
      local_488 = lVar3 - (ulong)uVar1;
    }
    else {
      local_488 = 0x404;
    }
    iVar2 = fseek((FILE *)fin,(ulong)uVar1,0);
    if (iVar2 != 0) {
      return (BYTE *)0x0;
    }
    sVar4 = fread((void *)((long)&eod.DirectorySize + 2),1,local_488 & 0xffffffff,(FILE *)fin);
    if (sVar4 != (local_488 & 0xffffffff)) {
      return (BYTE *)0x0;
    }
    iVar2 = (int)local_488 + -3;
    do {
      local_474 = iVar2;
      iVar2 = local_474 + -1;
      if (local_474 < 1) goto LAB_00104016;
    } while ((((buf[(long)iVar2 + -8] != 'P') || (buf[(long)local_474 + -8] != 'K')) ||
             (buf[(long)(local_474 + 1) + -8] != '\x05')) ||
            (buf[(long)(local_474 + 2) + -8] != '\x06'));
    _read_pos = (ulong)(uVar1 + iVar2);
LAB_00104016:
  } while (_read_pos == 0);
  if (((_read_pos == 0) || (iVar2 = fseek((FILE *)fin,_read_pos,0), iVar2 != 0)) ||
     ((sVar4 = fread((void *)((long)&dir + 2),0x16,1,(FILE *)fin), sVar4 != 1 ||
      (iVar2 = fseek((FILE *)fin,(ulong)(uint)eod._8_4_,0), iVar2 != 0)))) {
    fin_local = (FILE *)0x0;
  }
  else {
    fin_local = (FILE *)malloc((ulong)(eod._4_4_ + 4));
    if (fin_local == (FILE *)0x0) {
      no_mem = 1;
      fin_local = (FILE *)0x0;
    }
    else {
      sVar4 = fread(fin_local,1,(ulong)(uint)eod._4_4_,(FILE *)fin);
      if (sVar4 == (uint)eod._4_4_) {
        if (fin_local->_flags == 0x2014b50) {
          *(undefined4 *)((long)&fin_local->_flags + (ulong)(uint)eod._4_4_) = 0x6054b50;
        }
        else {
          free(fin_local);
          fin_local = (FILE *)0x0;
        }
      }
      else {
        free(fin_local);
        fin_local = (FILE *)0x0;
      }
    }
  }
  return (BYTE *)fin_local;
}

Assistant:

BYTE *find_central_dir(FILE *fin)
{
	unsigned char buf[BUFREADCOMMENT + 4];
	EndOfCentralDirectory eod;
	BYTE *dir;
	long file_size;
	long back_read;
	long max_back;		// maximum size of global comment
	long pos_found = 0;

	fseek(fin, 0, SEEK_END);

	file_size = ftell(fin);
	max_back = 0xffff > file_size ? file_size : 0xffff;

	back_read = 4;
	while (back_read < max_back)
	{
		UINT32 read_size, read_pos;
		int i;
		if (back_read + BUFREADCOMMENT > max_back) 
			back_read = max_back;
		else
			back_read += BUFREADCOMMENT;
		read_pos = file_size - back_read;

		read_size = (BUFREADCOMMENT + 4) < (file_size - read_pos) ?
					(BUFREADCOMMENT + 4) : (file_size - read_pos);

		if (fseek(fin, read_pos, SEEK_SET) != 0)
			return NULL;

		if (fread(buf, 1, read_size, fin) != read_size)
			return NULL;

		for (i = (int)read_size - 3; (i--) > 0;)
		{
			if (buf[i] == 'P' && buf[i+1] == 'K' && buf[i+2] == 5 && buf[i+3] == 6)
			{
				pos_found = read_pos + i;
				break;
			}
		}

		if (pos_found != 0)
			break;
	}
	if (pos_found == 0 ||
		fseek(fin, pos_found, SEEK_SET) != 0 ||
		fread(&eod, sizeof(eod), 1, fin) != 1 ||
		fseek(fin, LittleLong(eod.DirectoryOffset), SEEK_SET) != 0)
	{
		return NULL;
	}
	dir = malloc(LittleLong(eod.DirectorySize) + 4);
	if (dir == NULL)
	{
		no_mem = 1;
		return NULL;
	}
	if (fread(dir, 1, LittleLong(eod.DirectorySize), fin) != LittleLong(eod.DirectorySize))
	{
		free(dir);
		return NULL;
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		free(dir);
		return NULL;
	}
	memcpy(dir + LittleLong(eod.DirectorySize), (const BYTE *)&endofdir, sizeof(UINT32));
	return dir;
}